

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

void __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
SwapFallback<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
          (RepeatedPtrFieldBase *this,RepeatedPtrFieldBase *other)

{
  undefined1 uVar1;
  long lVar2;
  RepeatedPtrFieldBase temp;
  undefined1 local_38 [16];
  Arena *local_28;
  LogMessageFatal local_20;
  
  local_28 = other->arena_;
  if (this->arena_ == local_28) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x226,"!internal::CanUseInternalSwap(GetArena(), other->GetArena())");
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)local_38)
    ;
  }
  local_38._0_8_ = (void *)0x0;
  local_38._8_8_ = (LogMessageData *)0x0;
  if (this->current_size_ != 0) {
    MergeFromConcreteMessage
              ((RepeatedPtrFieldBase *)local_38,this,
               Arena::CopyConstruct<proto2_unittest::TestAllTypes>);
  }
  CopyFrom<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
            (this,other);
  if ((RepeatedPtrFieldBase *)local_38 != other) {
    lVar2 = 0;
    do {
      uVar1 = *(undefined1 *)((long)&other->tagged_rep_or_elem_ + lVar2);
      *(undefined1 *)((long)&other->tagged_rep_or_elem_ + lVar2) = local_38[lVar2];
      local_38[lVar2] = uVar1;
      lVar2 = lVar2 + 1;
    } while (lVar2 != 0x10);
    if ((void *)local_38._0_8_ != (void *)0x0) {
      Destroy<google::protobuf::internal::GenericTypeHandler<proto2_unittest::TestAllTypes>>
                ((RepeatedPtrFieldBase *)local_38);
    }
    ~RepeatedPtrFieldBase((RepeatedPtrFieldBase *)local_38);
    return;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            (&local_20,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/repeated_ptr_field.h"
             ,0x145,"this != rhs");
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_20);
}

Assistant:

inline Arena* GetArena() const { return arena_; }